

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SleepImpl.cpp
# Opt level: O1

void sf::priv::sleepImpl(Time time)

{
  int iVar1;
  Int64 IVar2;
  int *piVar3;
  timespec ti;
  Time local_20;
  timespec local_18;
  
  IVar2 = Time::asMicroseconds(&local_20);
  local_18.tv_sec = IVar2 / 1000000;
  local_18.tv_nsec = (IVar2 % 1000000) * 1000;
  do {
    iVar1 = nanosleep(&local_18,&local_18);
    if (iVar1 != -1) {
      return;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  return;
}

Assistant:

void sleepImpl(Time time)
{
    Int64 usecs = time.asMicroseconds();

    // Construct the time to wait
    timespec ti;
    ti.tv_nsec = static_cast<long>((usecs % 1000000) * 1000);
    ti.tv_sec = static_cast<time_t>(usecs / 1000000);

    // Wait...
    // If nanosleep returns -1, we check errno. If it is EINTR
    // nanosleep was interrupted and has set ti to the remaining
    // duration. We continue sleeping until the complete duration
    // has passed. We stop sleeping if it was due to an error.
    while ((nanosleep(&ti, &ti) == -1) && (errno == EINTR))
    {
    }
}